

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O2

void __thiscall
spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator>::delete_old_
          (daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *this)

{
  circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  filename_t *pfVar3;
  int *piVar4;
  type old_filename;
  filename_t current_file;
  filename_t fStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pfVar3 = details::file_helper::filename_abi_cxx11_(&this->file_helper_);
  std::__cxx11::string::string((string *)&local_78,(string *)pfVar3);
  this_00 = &this->filenames_q_;
  bVar1 = details::
          circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::full(this_00);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&fStack_98,
               (string *)
               ((this->filenames_q_).v_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (this->filenames_q_).head_));
    (this->filenames_q_).head_ = ((this->filenames_q_).head_ + 1) % (this->filenames_q_).max_items_;
    iVar2 = details::os::remove_if_exists(&fStack_98);
    if (iVar2 != 0) {
      details::
      circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      push_back(this_00,&local_78);
      details::os::filename_to_str(&local_58,&fStack_98);
      std::operator+(&local_38,"Failed removing daily file ",&local_58);
      piVar4 = __errno_location();
      throw_spdlog_ex(&local_38,*piVar4);
    }
    std::__cxx11::string::~string((string *)&fStack_98);
  }
  details::
  circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push_back(this_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void delete_old_()
    {
        using details::os::filename_to_str;
        using details::os::remove_if_exists;

        filename_t current_file = file_helper_.filename();
        if (filenames_q_.full())
        {
            auto old_filename = std::move(filenames_q_.front());
            filenames_q_.pop_front();
            bool ok = remove_if_exists(old_filename) == 0;
            if (!ok)
            {
                filenames_q_.push_back(std::move(current_file));
                throw_spdlog_ex("Failed removing daily file " + filename_to_str(old_filename), errno);
            }
        }
        filenames_q_.push_back(std::move(current_file));
    }